

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O3

int __thiscall CCEXP::CCEXPMat<int>::NewRow(CCEXPMat<int> *this,int empty)

{
  int iVar1;
  MVECTOR<int> dl;
  value_type local_58;
  
  iVar1 = 0;
  if (this->IgnoreM == false) {
    if ((ulong)((long)(this->data).
                      super__Vector_base<ns_MVECTOR::MVECTOR<int>,_std::allocator<ns_MVECTOR::MVECTOR<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data).
                      super__Vector_base<ns_MVECTOR::MVECTOR<int>,_std::allocator<ns_MVECTOR::MVECTOR<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < this->_maxRows) {
      this->newRowFlag = true;
      iVar1 = 0;
      if (empty == 1) {
        ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&local_58.super_MVECTOR_Base);
        local_58.elements._4_4_ = 0;
        local_58.mem_elements = 0;
        local_58._4_8_ = 0;
        local_58.pdata._4_4_ = 0;
        local_58.elements._0_4_ = 0;
        local_58.step_elements = 0x400;
        local_58.step_elements_back = 0x2800;
        local_58.sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<ns_MVECTOR::MVECTOR<int>,_std::allocator<ns_MVECTOR::MVECTOR<int>_>_>::push_back
                  (&this->data,&local_58);
        ns_MVECTOR::MVECTOR<int>::~MVECTOR(&local_58);
      }
    }
    else {
      iVar1 = -9999;
      CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x161,
                     "CCEXPMat::NewRow():: Maximum Rows (=%zu) already Reached!",this->_maxRows);
    }
  }
  return iVar1;
}

Assistant:

int CCEXPMat<T>::NewRow(int empty) {
	if (IgnoreM) return 0;
	const size_t N = data.size();
	CECS_ERRI(CCEXPECS,N >= _maxRows,"CCEXPMat::NewRow():: Maximum Rows (=" __ZU__ ") already Reached!", _maxRows);

	newRowFlag=true;
	if (empty == 1) {
		MVECTOR<T> dl; dl.clear(); data.push_back(dl);
	}
	return 0;
}